

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

int adl_getBank(ADL_MIDIPlayer *device,ADL_BankId *idp,int flags,ADL_Bank *bank)

{
  long lVar1;
  value_type *__return_storage_ptr__;
  BasicBankMap<OPL3::Bank> *this;
  undefined1 local_13c8 [16];
  void *local_13b8;
  value_type local_13a8;
  
  __return_storage_ptr__ = (value_type *)local_13c8;
  if (bank == (ADL_Bank *)0x0 || (idp == (ADL_BankId *)0x0 || device == (ADL_MIDIPlayer *)0x0)) {
    return -1;
  }
  if (1 < idp->percussive || (char)(idp->lsb | idp->msb) < '\0') {
    return -1;
  }
  if (device->adl_midiPlayer == (void *)0x0) {
    __assert_fail("play",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                  ,0x10d,"int adl_getBank(ADL_MIDIPlayer *, const ADL_BankId *, int, ADL_Bank *)");
  }
  local_13a8.first = (ulong)(idp->percussive != 0) << 0xf | (ulong)idp->lsb | (ulong)idp->msb << 8;
  this = (BasicBankMap<OPL3::Bank> *)(*(long *)((long)device->adl_midiPlayer + 0x198) + 0xa0);
  if ((flags & 1U) == 0) {
    __return_storage_ptr__ = &local_13a8;
    BasicBankMap<OPL3::Bank>::find((iterator *)__return_storage_ptr__,this,local_13a8.first);
  }
  else {
    memset(&local_13a8.second,0,0x1380);
    for (lVar1 = 0x21; lVar1 != 0x13a1; lVar1 = lVar1 + 0x27) {
      *(undefined1 *)((long)local_13a8.second.ins[0].op + lVar1 + -8) = 2;
    }
    if ((~flags & 3U) != 0) {
      BasicBankMap<OPL3::Bank>::insert
                ((pair<BasicBankMap<OPL3::Bank>::iterator,_bool> *)local_13c8,this,&local_13a8);
      goto LAB_0012bead;
    }
    BasicBankMap<OPL3::Bank>::insert(local_13c8,this,&local_13a8);
  }
  local_13c8._0_8_ = __return_storage_ptr__->first;
  local_13c8._8_8_ = *(undefined8 *)(__return_storage_ptr__->second).ins[0].op;
  local_13b8 = *(void **)&(__return_storage_ptr__->second).ins[0].op[0].modulator_40;
  if ((this->m_buckets).
      super_AdlMIDI_SPtr<BasicBankMap<OPL3::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPL3::Bank>::Slot_*>_>
      .m_p == (Slot **)local_13c8._0_8_ && (Slot *)local_13c8._8_8_ == (Slot *)0x0) {
    if (local_13b8 == (void *)0x100) {
      return -1;
    }
    local_13c8._8_8_ = (Slot *)0x0;
  }
LAB_0012bead:
  bank->pointer[0] = (void *)local_13c8._0_8_;
  bank->pointer[1] = (void *)local_13c8._8_8_;
  bank->pointer[2] = local_13b8;
  return 0;
}

Assistant:

ADLMIDI_EXPORT int adl_getBank(ADL_MIDIPlayer *device, const ADL_BankId *idp, int flags, ADL_Bank *bank)
{
    if(!device || !idp || !bank)
        return -1;

    ADL_BankId id = *idp;
    if(id.lsb > 127 || id.msb > 127 || id.percussive > 1)
        return -1;
    size_t idnumber = ((id.msb << 8) | id.lsb | (id.percussive ? size_t(Synth::PercussionTag) : 0));

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;

    Synth::BankMap::iterator it;
    if(!(flags & ADLMIDI_Bank_Create))
    {
        it = map.find(idnumber);
        if(it == map.end())
            return -1;
    }
    else
    {
        std::pair<size_t, Synth::Bank> value;
        value.first = idnumber;
        memset(&value.second, 0, sizeof(value.second));
        for (unsigned i = 0; i < 128; ++i)
            value.second.ins[i].flags = OplInstMeta::Flag_NoSound;

        std::pair<Synth::BankMap::iterator, bool> ir;
        if((flags & ADLMIDI_Bank_CreateRt) == ADLMIDI_Bank_CreateRt)
        {
            ir = map.insert(value, Synth::BankMap::do_not_expand_t());
            if(ir.first == map.end())
                return -1;
        }
        else
            ir = map.insert(value);
        it = ir.first;
    }

    it.to_ptrs(bank->pointer);
    return 0;
}